

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O0

Matrix * __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::getAMatrix
          (Matrix *__return_storage_ptr__,IMUMltpctiveDynamicalSystem *this,Vector *xh)

{
  Type local_5a0;
  int local_56c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_568;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_548;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_508;
  double local_4a8;
  Type local_4a0;
  DiagonalReturnType local_470;
  Type local_438;
  DiagonalReturnType local_408;
  Type local_3d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_3a0;
  Type local_380;
  DiagonalReturnType local_350;
  Type local_318;
  int local_2e4;
  Type local_2e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_268;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_200;
  Type local_178;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_148;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_100;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_20;
  Vector *xh_local;
  IMUMltpctiveDynamicalSystem *this_local;
  
  local_20 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh;
  xh_local = (Vector *)this;
  this_local = (IMUMltpctiveDynamicalSystem *)__return_storage_ptr__;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_178,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh,10,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator*
            (&local_148,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_178,&this->dt_);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_2e0,local_20,0x10,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator*
            (&local_2b0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_2e0,&this->dt_);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*(&local_268,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_2b0,&this->dt_);
  local_2e4 = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/(&local_200,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_268,&local_2e4);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+(&local_100,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_148,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)&local_200);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)&(this->opt_).deltaR,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
              *)&local_100);
  kine::derivateRotationMultiplicative(&(this->opt_).deltaR,&(this->opt_).jRR,&(this->opt_).jRv);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
            (&local_318,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->opt_).AJacobian,3,
             3);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,3,false> *)&local_318,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&this->opt_);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
            (&local_380,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->opt_).AJacobian,0,
             6);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>_>::diagonal
            (&local_350,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false>_> *)
             &local_380);
  Eigen::
  DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>,_0>_>
  ::setConstant((DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false>,_0>_>
                 *)&local_350,&this->dt_);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (&local_3a0,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&(this->opt_).jRv,&this->dt_)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
            (&local_3d0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->opt_).AJacobian,3,
             9);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,3,false> *)&local_3d0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_3a0);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<6,6>
            (&local_438,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->opt_).AJacobian,6,
             0xc);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_6,_6,_false>_>::diagonal
            (&local_408,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_6,_6,_false>_> *)
             &local_438);
  Eigen::
  DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_6,_6,_false>,_0>_>
  ::setConstant((DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_6,_6,_false>,_0>_>
                 *)&local_408,&this->dt_);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
            (&local_4a0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->opt_).AJacobian,0,
             0xc);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>_>::diagonal
            (&local_470,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false>_> *)
             &local_4a0);
  local_4a8 = this->dt_ * this->dt_ * 0.5;
  Eigen::
  DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>,_0>_>
  ::setConstant((DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false>,_0>_>
                 *)&local_470,&local_4a8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (&local_568,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&(this->opt_).jRv,&this->dt_)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
  ::operator*(&local_548,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
               *)&local_568,&this->dt_);
  local_56c = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
  ::operator/(&local_508,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
               *)&local_548,&local_56c);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,3>
            (&local_5a0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->opt_).AJacobian,3,
             0xf);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,3,false> *)&local_5a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_508);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(__return_storage_ptr__,&(this->opt_).AJacobian);
  return __return_storage_ptr__;
}

Assistant:

Matrix IMUMltpctiveDynamicalSystem::getAMatrix(const Vector & xh)
{

  opt_.deltaR = xh.segment<3>(indexes::angVel) * dt_ + xh.segment<3>(indexes::angAcc) * dt_ * dt_ / 2;

  kine::derivateRotationMultiplicative(opt_.deltaR, opt_.jRR, opt_.jRv);

  opt_.AJacobian.block<3, 3>(indexesTangent::ori, indexesTangent::ori) = opt_.jRR;

  opt_.AJacobian.block<3, 3>(indexesTangent::pos, indexesTangent::linVel).diagonal().setConstant(dt_);
  opt_.AJacobian.block<3, 3>(indexesTangent::ori, indexesTangent::angVel) = opt_.jRv * dt_;
  opt_.AJacobian.block<6, 6>(indexesTangent::linVel, indexesTangent::linAcc).diagonal().setConstant(dt_);

  opt_.AJacobian.block<3, 3>(indexesTangent::pos, indexesTangent::linAcc).diagonal().setConstant(dt_ * dt_ * 0.5);
  opt_.AJacobian.block<3, 3>(indexesTangent::ori, indexesTangent::angAcc) = opt_.jRv * dt_ * dt_ / 2;

  return opt_.AJacobian;
}